

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

ndicapi * ndiOpenSerial(char *device)

{
  int serial_port;
  int iVar1;
  ndicapi *__s;
  size_t sVar2;
  char *__dest;
  char *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  
  serial_port = ndiSerialOpen(device);
  if (serial_port != -1) {
    iVar1 = ndiSerialComm(serial_port,0x2580,"8N1",0);
    if (((-1 < iVar1) && (iVar1 = ndiSerialFlush(serial_port,3), -1 < iVar1)) &&
       (__s = (ndicapi *)malloc(0x65b8), __s != (ndicapi *)0x0)) {
      memset(__s,0,0x65b8);
      __s->SerialDevice = serial_port;
      sVar2 = strlen(device);
      __dest = (char *)malloc(sVar2 + 1);
      __s->SerialDeviceName = __dest;
      __ptr = (char *)malloc(0x800);
      __s->Command = __ptr;
      __ptr_00 = (char *)malloc(0x800);
      __s->Reply = __ptr_00;
      __ptr_01 = (char *)malloc(0x800);
      __s->ReplyNoCRC = __ptr_01;
      __s->Hostname = (char *)0x0;
      __s->Port = -1;
      __s->Socket = -1;
      if (((__dest != (char *)0x0) && (__ptr != (char *)0x0)) &&
         ((__ptr_00 != (char *)0x0 && (__ptr_01 != (char *)0x0)))) {
        strcpy(__dest,device);
        memset(__ptr,0,0x800);
        memset(__ptr_00,0,0x800);
        memset(__ptr_01,0,0x800);
        return __s;
      }
      if (__dest != (char *)0x0) {
        free(__dest);
      }
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (char *)0x0) {
        free(__ptr_00);
      }
      if (__ptr_01 != (char *)0x0) {
        free(__ptr_01);
      }
    }
    ndiSerialClose(serial_port);
  }
  return (ndicapi *)0x0;
}

Assistant:

ndicapiExport ndicapi* ndiOpenSerial(const char* device)
{
  NDIFileHandle serial_port;
  ndicapi* pol;

  serial_port = ndiSerialOpen(device);

  if (serial_port == NDI_INVALID_HANDLE)
  {
    return NULL;
  }

  if (ndiSerialComm(serial_port, 9600, "8N1", 0) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  if (ndiSerialFlush(serial_port, NDI_IOFLUSH) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  pol = (ndicapi*)malloc(sizeof(ndicapi));

  if (pol == 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  memset(pol, 0, sizeof(ndicapi));
  pol->SerialDevice = serial_port;

  // allocate the buffers
  pol->SerialDeviceName = (char*)malloc(strlen(device) + 1);
  pol->Command = (char*)malloc(2048);
  pol->Reply = (char*)malloc(2048);
  pol->ReplyNoCRC = (char*)malloc(2048);
  pol->Hostname = NULL;
  pol->Port = -1;
  pol->Socket = -1;

  if (pol->SerialDeviceName == 0 || pol->Command == 0 || pol->Reply == 0 || pol->ReplyNoCRC == 0)
  {
    if (pol->SerialDeviceName)
    {
      free(pol->SerialDeviceName);
    }
    if (pol->Command)
    {
      free(pol->Command);
    }
    if (pol->Reply)
    {
      free(pol->Reply);
    }
    if (pol->ReplyNoCRC)
    {
      free(pol->ReplyNoCRC);
    }

    ndiSerialClose(serial_port);
    return NULL;
  }

  // initialize the allocated memory
  strcpy(pol->SerialDeviceName, device);
  memset(pol->Command, 0, 2048);
  memset(pol->Reply, 0, 2048);
  memset(pol->ReplyNoCRC, 0, 2048);

  return pol;
}